

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyFixLanguageInformation(TidyDocImpl *doc,Node *node,Bool wantXmlLang,Bool wantLang)

{
  Bool BVar1;
  uint uVar2;
  Stack *stack_00;
  AttVal *attr;
  AttVal *attr_00;
  Node *local_48;
  AttVal *xmlLang;
  AttVal *lang;
  Node *next;
  Stack *stack;
  Bool wantLang_local;
  Bool wantXmlLang_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  stack_00 = prvTidynewStack(doc,0x10);
  _wantLang_local = node;
  while (_wantLang_local != (Node *)0x0) {
    local_48 = _wantLang_local->next;
    BVar1 = prvTidynodeIsElement(_wantLang_local);
    if (BVar1 != no) {
      attr = prvTidyAttrGetById(_wantLang_local,TidyAttr_LANG);
      attr_00 = prvTidyAttrGetById(_wantLang_local,TidyAttr_XML_LANG);
      if ((attr == (AttVal *)0x0) || (attr_00 == (AttVal *)0x0)) {
        if ((attr == (AttVal *)0x0) || (wantXmlLang == no)) {
          if (((attr_00 != (AttVal *)0x0) && (wantLang != no)) &&
             (uVar2 = prvTidyNodeAttributeVersions(_wantLang_local,TidyAttr_LANG),
             (uVar2 & doc->lexer->versionEmitted) != 0)) {
            prvTidyRepairAttrValue(doc,_wantLang_local,"lang",attr_00->value);
          }
        }
        else {
          uVar2 = prvTidyNodeAttributeVersions(_wantLang_local,TidyAttr_XML_LANG);
          if ((uVar2 & doc->lexer->versionEmitted) != 0) {
            prvTidyRepairAttrValue(doc,_wantLang_local,"xml:lang",attr->value);
          }
        }
      }
      if ((attr != (AttVal *)0x0) && (wantLang == no)) {
        prvTidyRemoveAttribute(doc,_wantLang_local,attr);
      }
      if ((attr_00 != (AttVal *)0x0) && (wantXmlLang == no)) {
        prvTidyRemoveAttribute(doc,_wantLang_local,attr_00);
      }
    }
    if (_wantLang_local->content == (Node *)0x0) {
      if (local_48 == (Node *)0x0) {
        local_48 = prvTidypop(stack_00);
      }
      _wantLang_local = local_48;
    }
    else {
      prvTidypush(stack_00,local_48);
      _wantLang_local = _wantLang_local->content;
    }
  }
  prvTidyfreeStack(stack_00);
  return;
}

Assistant:

void TY_(FixLanguageInformation)(TidyDocImpl* doc, Node* node, Bool wantXmlLang, Bool wantLang)
{
    Stack *stack = TY_(newStack)(doc, 16);
    Node* next;

    while (node)
    {
        next = node->next;

        /* todo: report modifications made here to the report system */

        if (TY_(nodeIsElement)(node))
        {
            AttVal* lang = TY_(AttrGetById)(node, TidyAttr_LANG);
            AttVal* xmlLang = TY_(AttrGetById)(node, TidyAttr_XML_LANG);

            if (lang && xmlLang)
            {
                /*
                  todo: check whether both attributes are in sync,
                  here or elsewhere, where elsewhere is probably
                  preferable.
                  AD - March 2005: not mandatory according the standards.
                */
            }
            else if (lang && wantXmlLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_XML_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "xml:lang", lang->value);
            }
            else if (xmlLang && wantLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "lang", xmlLang->value);
            }

            if (lang && !wantLang)
                TY_(RemoveAttribute)(doc, node, lang);
            
            if (xmlLang && !wantXmlLang)
                TY_(RemoveAttribute)(doc, node, xmlLang);
        }

        if (node->content)
        {
            TY_(push)(stack, next);
            node = node->content;
            continue;
        }

        node = next ? next : TY_(pop)(stack);
    }
    TY_(freeStack)(stack);
}